

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O2

timeval * zt_sub_time(timeval *st,timeval *t1,timeval *t2)

{
  long lVar1;
  long lVar2;
  
  lVar1 = t1->tv_sec - t2->tv_sec;
  st->tv_sec = lVar1;
  for (lVar2 = t1->tv_usec - t2->tv_usec; lVar1 = lVar1 + -1, lVar2 < 0; lVar2 = lVar2 + 1000000) {
    st->tv_sec = lVar1;
  }
  st->tv_usec = lVar2;
  return st;
}

Assistant:

struct timeval *
zt_sub_time(struct timeval *st, struct timeval *t1, struct timeval *t2)
{
    st->tv_sec = t1->tv_sec - t2->tv_sec;
    st->tv_usec = t1->tv_usec - t2->tv_usec;

    while (st->tv_usec < 0) {
        st->tv_sec--;
        st->tv_usec += 1000000;
    }

    return st;
}